

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

void Parser_freeNodeContent(IXML_Node *nodeptr)

{
  if (nodeptr != (IXML_Node *)0x0) {
    if (nodeptr->nodeName != (char *)0x0) {
      free(nodeptr->nodeName);
    }
    if (nodeptr->nodeValue != (char *)0x0) {
      free(nodeptr->nodeValue);
    }
    if (nodeptr->namespaceURI != (char *)0x0) {
      free(nodeptr->namespaceURI);
    }
    if (nodeptr->prefix != (char *)0x0) {
      free(nodeptr->prefix);
    }
    if (nodeptr->localName != (char *)0x0) {
      free(nodeptr->localName);
      return;
    }
  }
  return;
}

Assistant:

void Parser_freeNodeContent(IXML_Node *nodeptr)
{
	if (nodeptr == NULL) {
		return;
	}

	if (nodeptr->nodeName != NULL) {
		free(nodeptr->nodeName);
	}

	if (nodeptr->nodeValue != NULL) {
		free(nodeptr->nodeValue);
	}

	if (nodeptr->namespaceURI != NULL) {
		free(nodeptr->namespaceURI);
	}

	if (nodeptr->prefix != NULL) {
		free(nodeptr->prefix);
	}

	if (nodeptr->localName != NULL) {
		free(nodeptr->localName);
	}
}